

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreachable.cc
# Opt level: O3

void __thiscall re2c::Skeleton::warn_unreachable_rules(Skeleton *this)

{
  Node *pNVar1;
  bool bVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Rb_tree_header *p_Var6;
  ulong uVar7;
  rule_rank_t r;
  rule_rank_t r2;
  rule_rank_t r1;
  rule_rank_t local_3c;
  rule_rank_t local_38;
  rule_rank_t local_34;
  
  Node::calc_reachable(this->nodes);
  uVar5 = this->nodes_count;
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      pNVar1 = this->nodes;
      p_Var6 = &pNVar1[uVar7].reachable._M_t._M_impl.super__Rb_tree_header;
      local_34.value = pNVar1[uVar7].rule.rank.value;
      p_Var4 = pNVar1[uVar7].reachable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var4 != p_Var6) {
        do {
          local_38.value = p_Var4[1]._M_color;
          bVar2 = rule_rank_t::operator==(&local_34,&local_38);
          if (bVar2) {
LAB_0013abda:
            pmVar3 = std::
                     map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                     ::operator[](&this->rules,&local_34);
            pmVar3->reachable = true;
          }
          else {
            bVar2 = rule_rank_t::is_none(&local_38);
            if (bVar2) goto LAB_0013abda;
            pmVar3 = std::
                     map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                     ::operator[](&this->rules,&local_34);
            std::
            _Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
            ::_M_insert_unique<re2c::rule_rank_t_const&>
                      ((_Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
                        *)&pmVar3->shadow,&local_38);
          }
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var6);
        uVar5 = this->nodes_count;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < uVar5);
  }
  p_Var4 = (this->rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      local_3c.value = p_Var4[1]._M_color;
      bVar2 = rule_rank_t::is_none(&local_3c);
      if (!bVar2) {
        bVar2 = rule_rank_t::is_def(&local_3c);
        if (!bVar2) {
          pmVar3 = std::
                   map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                   ::operator[](&this->rules,&local_3c);
          if (pmVar3->reachable == false) {
            Warn::unreachable_rule
                      ((Warn *)warn,&this->cond,(rule_info_t *)&p_Var4[1]._M_parent,&this->rules);
          }
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  return;
}

Assistant:

void Skeleton::warn_unreachable_rules ()
{
	nodes->calc_reachable ();
	for (uint32_t i = 0; i < nodes_count; ++i)
	{
		const rule_rank_t r1 = nodes[i].rule.rank;
		const std::set<rule_t> & rs = nodes[i].reachable;
		for (std::set<rule_t>::const_iterator j = rs.begin (); j != rs.end (); ++j)
		{
			const rule_rank_t r2 = j->rank;
			if (r1 == r2 || r2.is_none ())
			{
				rules[r1].reachable = true;
			}
			else
			{
				rules[r1].shadow.insert (r2);
			}
		}
	}

	// warn about unreachable rules:
	//   - rules that are shadowed by other rules, e.g. rule '[a]' is shadowed by '[a] [^]'
	//   - infinite rules that consume infinitely many characters and fail on YYFILL, e.g. '[^]*'
	//   - rules that contain never-matching link, e.g. '[]' with option '--empty-class match-none'
	// default rule '*' should not be reported
	for (rules_t::const_iterator i = rules.begin (); i != rules.end (); ++i)
	{
		const rule_rank_t r = i->first;
		if (!r.is_none () && !r.is_def () && !rules[r].reachable)
		{
			warn.unreachable_rule (cond, i->second, rules);
		}
	}
}